

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  byte bVar2;
  uchar uVar3;
  cJSON_bool cVar4;
  cJSON_bool cVar5;
  uint uVar6;
  int iVar7;
  uchar *puVar8;
  size_t sVar9;
  lconv *plVar10;
  ulong uVar11;
  ulong uVar12;
  uchar uVar13;
  cJSON *pcVar14;
  size_t sVar15;
  long lVar16;
  long in_FS_OFFSET;
  uchar number_buffer [26];
  double local_60;
  uchar local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = 0;
  cVar5 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    bVar2 = (byte)item->type;
    cVar5 = cVar4;
    if (bVar2 < 0x10) {
      switch(bVar2) {
      case 1:
        puVar8 = ensure(output_buffer,6);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"false",6);
LAB_0010309a:
          cVar5 = 1;
        }
        break;
      case 2:
        puVar8 = ensure(output_buffer,5);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"true",5);
          goto LAB_0010309a;
        }
        break;
      case 4:
        puVar8 = ensure(output_buffer,5);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"null",5);
          goto LAB_0010309a;
        }
        break;
      case 8:
        dVar1 = item->valuedouble;
        plVar10 = localeconv();
        uVar3 = *plVar10->decimal_point;
        if ((dVar1 * 0.0 != 0.0) || (NAN(dVar1 * 0.0))) {
          builtin_memcpy(local_58,"null",5);
          uVar12 = 4;
          puVar8 = ensure(output_buffer,4);
          if (puVar8 == (uchar *)0x0) {
LAB_00103051:
            cVar5 = 0;
            break;
          }
LAB_00102d6b:
          uVar11 = 0;
          do {
            uVar13 = local_58[uVar11];
            if (local_58[uVar11] == uVar3) {
              uVar13 = '.';
            }
            puVar8[uVar11] = uVar13;
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
LAB_00102d89:
          puVar8[uVar12] = '\0';
          output_buffer->offset = output_buffer->offset + uVar12;
          goto LAB_0010309a;
        }
        uVar6 = sprintf((char *)local_58,"%1.15g");
        iVar7 = __isoc99_sscanf(local_58,"%lg",&local_60);
        if (iVar7 == 1) {
          if ((local_60 != dVar1) || (NAN(local_60) || NAN(dVar1))) goto LAB_00102ffd;
        }
        else {
LAB_00102ffd:
          uVar6 = sprintf((char *)local_58,"%1.17g");
        }
        cVar5 = 0;
        if (uVar6 < 0x1a) {
          uVar12 = (ulong)uVar6;
          puVar8 = ensure(output_buffer,uVar12);
          if (puVar8 != (uchar *)0x0) {
            if (uVar6 != 0) goto LAB_00102d6b;
            uVar12 = 0;
            goto LAB_00102d89;
          }
        }
      }
    }
    else if (bVar2 < 0x40) {
      if (bVar2 == 0x10) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          cVar5 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar5;
        }
        goto LAB_001030be;
      }
      if (bVar2 == 0x20) {
        pcVar14 = item->child;
        puVar8 = ensure(output_buffer,1);
        if (puVar8 != (uchar *)0x0) {
          *puVar8 = '[';
          output_buffer->offset = output_buffer->offset + 1;
          output_buffer->depth = output_buffer->depth + 1;
          for (; pcVar14 != (cJSON *)0x0; pcVar14 = pcVar14->next) {
            cVar4 = print_value(pcVar14,output_buffer);
            if (cVar4 == 0) goto switchD_00102bb7_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar9 + sVar15;
            }
            if (pcVar14->next == (cJSON *)0x0) break;
            uVar12 = (ulong)(output_buffer->format == 0);
            puVar8 = ensure(output_buffer,uVar12 ^ 3);
            if (puVar8 == (uchar *)0x0) goto switchD_00102bb7_caseD_3;
            *puVar8 = ',';
            if (output_buffer->format == 0) {
              puVar8 = puVar8 + 1;
            }
            else {
              puVar8[1] = ' ';
              puVar8 = puVar8 + 2;
            }
            *puVar8 = '\0';
            output_buffer->offset = output_buffer->offset + (2 - uVar12);
          }
          puVar8 = ensure(output_buffer,2);
          cVar5 = 0;
          if (puVar8 != (uchar *)0x0) {
            puVar8[0] = ']';
            puVar8[1] = '\0';
            goto LAB_00103096;
          }
        }
      }
    }
    else if (bVar2 == 0x40) {
      pcVar14 = item->child;
      uVar12 = (ulong)(output_buffer->format == 0);
      puVar8 = ensure(output_buffer,uVar12 ^ 3);
      if (puVar8 != (uchar *)0x0) {
        *puVar8 = '{';
        output_buffer->depth = output_buffer->depth + 1;
        if (output_buffer->format != 0) {
          puVar8[1] = '\n';
        }
        output_buffer->offset = output_buffer->offset + (2 - uVar12);
        if (pcVar14 != (cJSON *)0x0) {
          cVar5 = 0;
          do {
            if (output_buffer->format != 0) {
              puVar8 = ensure(output_buffer,output_buffer->depth);
              if (puVar8 == (uchar *)0x0) goto LAB_00103051;
              if (output_buffer->depth == 0) {
                uVar12 = 0;
              }
              else {
                uVar11 = 0;
                do {
                  puVar8[uVar11] = '\t';
                  uVar11 = uVar11 + 1;
                  uVar12 = output_buffer->depth;
                } while (uVar11 < uVar12);
              }
              output_buffer->offset = output_buffer->offset + uVar12;
            }
            cVar4 = print_string_ptr((uchar *)pcVar14->string,output_buffer);
            if (cVar4 == 0) goto switchD_00102bb7_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar9 + sVar15;
            }
            sVar15 = 2 - (ulong)(output_buffer->format == 0);
            puVar8 = ensure(output_buffer,sVar15);
            if (puVar8 == (uchar *)0x0) goto switchD_00102bb7_caseD_3;
            *puVar8 = ':';
            if (output_buffer->format != 0) {
              puVar8[1] = '\t';
            }
            output_buffer->offset = output_buffer->offset + sVar15;
            cVar4 = print_value(pcVar14,output_buffer);
            if (cVar4 == 0) goto switchD_00102bb7_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar9 + sVar15;
            }
            lVar16 = ((ulong)(pcVar14->next != (cJSON *)0x0) + 1) -
                     (ulong)(output_buffer->format == 0);
            puVar8 = ensure(output_buffer,lVar16 + 1);
            if (puVar8 == (uchar *)0x0) goto switchD_00102bb7_caseD_3;
            if (pcVar14->next != (cJSON *)0x0) {
              *puVar8 = ',';
              puVar8 = puVar8 + 1;
            }
            if (output_buffer->format != 0) {
              *puVar8 = '\n';
              puVar8 = puVar8 + 1;
            }
            *puVar8 = '\0';
            output_buffer->offset = output_buffer->offset + lVar16;
            pcVar14 = pcVar14->next;
          } while (pcVar14 != (cJSON *)0x0);
        }
        if (output_buffer->format == 0) {
          sVar15 = 2;
        }
        else {
          sVar15 = output_buffer->depth + 1;
        }
        puVar8 = ensure(output_buffer,sVar15);
        cVar5 = 0;
        if (puVar8 != (uchar *)0x0) {
          if ((output_buffer->format != 0) && (output_buffer->depth != 1)) {
            uVar12 = 0;
            do {
              puVar8[uVar12] = '\t';
              uVar12 = uVar12 + 1;
            } while (uVar12 < output_buffer->depth - 1);
            puVar8 = puVar8 + uVar12;
          }
          puVar8[0] = '}';
          puVar8[1] = '\0';
LAB_00103096:
          output_buffer->depth = output_buffer->depth - 1;
          goto LAB_0010309a;
        }
      }
    }
    else if (bVar2 == 0x80) {
      if (item->valuestring == (char *)0x0) {
        if (output_buffer->noalloc == 0) {
          (*(output_buffer->hooks).deallocate)(output_buffer->buffer);
        }
      }
      else {
        sVar9 = strlen(item->valuestring);
        puVar8 = ensure(output_buffer,sVar9 + 1);
        if (puVar8 != (uchar *)0x0) {
          memcpy(puVar8,item->valuestring,sVar9 + 1);
          goto LAB_0010309a;
        }
      }
    }
  }
switchD_00102bb7_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return cVar5;
  }
LAB_001030be:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                if (!output_buffer->noalloc)
                {
                    output_buffer->hooks.deallocate(output_buffer->buffer);
                }
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}